

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O3

char * __thiscall
Potassco::ProgramOptions::anon_unknown_15::CommandStringParser::next(CommandStringParser *this)

{
  byte bVar1;
  char *pcVar2;
  char cVar3;
  int iVar4;
  char *pcVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  byte *pbVar9;
  
  pbVar9 = (byte *)this->cmd_;
  bVar1 = *pbVar9;
  iVar4 = isspace((uint)bVar1);
  while (iVar4 != 0) {
    pbVar9 = pbVar9 + 1;
    this->cmd_ = (char *)pbVar9;
    bVar1 = *pbVar9;
    iVar4 = isspace((uint)bVar1);
  }
  if (bVar1 == 0) {
    pcVar5 = (char *)0x0;
  }
  else {
    (this->tok_)._M_string_length = 0;
    *(this->tok_)._M_dataplus._M_p = '\0';
    pcVar5 = this->cmd_;
    cVar3 = *pcVar5;
    if (cVar3 != '\0') {
      cVar6 = ' ';
      do {
        if (cVar3 == cVar6) {
          cVar7 = ' ';
          if (cVar3 == ' ') break;
        }
        else {
          cVar7 = cVar3;
          if (cVar3 != '\"' && cVar3 != '\'' || cVar6 != ' ') {
            cVar8 = (char)&this->tok_;
            cVar7 = cVar6;
            if (((cVar3 == '\\') && ((byte)pcVar5[1] - 0x22 < 0x3b)) &&
               ((0x400000000000021U >> ((ulong)((byte)pcVar5[1] - 0x22) & 0x3f) & 1) != 0)) {
              std::__cxx11::string::push_back(cVar8);
              this->cmd_ = this->cmd_ + 1;
            }
            else {
              std::__cxx11::string::push_back(cVar8);
            }
          }
        }
        pcVar2 = this->cmd_;
        pcVar5 = pcVar2 + 1;
        this->cmd_ = pcVar5;
        cVar3 = pcVar2[1];
        cVar6 = cVar7;
      } while (cVar3 != '\0');
    }
    pcVar5 = (this->tok_)._M_dataplus._M_p;
  }
  return pcVar5;
}

Assistant:

const char* next() {
		// skip leading white
		while (std::isspace(static_cast<unsigned char>(*cmd_))) { ++cmd_; }
		if (!*cmd_) return 0;
		tok_.clear();
		// find end of current arg
		for (char c, t = ' ', n; (c = *cmd_) != 0; ++cmd_) {
			if (c == t) { if (t == ' ') break; t = ' '; }
			else if ((c == '\'' || c == '"') && t == ' ') { t = c; }
			else if (c != '\\') { tok_ += c; }
			else if ((n = cmd_[1]) == '"' || n == '\'' || n == '\\') { tok_ += n; ++cmd_; }
			else { tok_ += c; }
		}
		return tok_.c_str();
	}